

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppleII.cpp
# Opt level: O1

bool __thiscall
Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)0,_true>::Keyboard::
set_key_pressed(Keyboard *this,Key key,char value,bool is_pressed,bool is_repeat)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  undefined3 in_register_00000081;
  byte bVar4;
  
  if ((CONCAT31(in_register_00000081,is_repeat) != 0) && (this->repeat_is_pressed_ != true)) {
    return true;
  }
  switch(key) {
  case Escape:
    bVar4 = 0x1b;
    break;
  case F1:
  case F2:
  case F3:
  case F4:
  case F5:
  case F6:
  case F7:
  case F8:
  case F9:
  case F10:
  case F11:
    this->repeat_is_pressed_ = is_pressed;
    if (!is_pressed) {
      return true;
    }
    if ((is_repeat) && (this->character_is_pressed_ != true)) {
      return true;
    }
    this->keyboard_input_ = this->last_pressed_character_ | 0x80;
    return true;
  case F12:
  case PrintScreen:
  case ScrollLock:
  case Pause:
  case Insert:
  case Home:
  case PageUp:
  case End:
  case PageDown:
    (this->m6502_->super_ProcessorBase).super_ProcessorStorage.interrupt_requests_ =
         is_pressed << 7 |
         (this->m6502_->super_ProcessorBase).super_ProcessorStorage.interrupt_requests_ & 0x7f;
    return true;
  default:
    if (value == '\0') {
      return false;
    }
    uVar1 = toupper((int)value);
    uVar3 = uVar1;
    if (this->control_is_pressed_ == true) {
      iVar2 = isalpha((int)(char)(byte)uVar1);
      uVar3 = (uint)((byte)uVar1 & 0xbf);
      if (iVar2 == 0) {
        uVar3 = uVar1 & 0xff;
      }
    }
    bVar4 = (byte)uVar3;
    if (((this->shift_is_pressed_ == true) && (uVar3 = uVar3 - 0x27, (byte)uVar3 < 0x17)) &&
       ((0x57ffa1U >> (uVar3 & 0x1f) & 1) != 0)) {
      bVar4 = "\"\"\"\"\"<\">?)!@#$%^&*(\":\"+"[uVar3 & 0xff];
    }
    break;
  case Backspace:
  case Tab:
  case LeftOption:
  case LeftMeta:
  case RightMeta:
  case RightOption:
    return false;
  case Enter:
    bVar4 = 0xd;
    break;
  case LeftShift:
  case RightShift:
    this->shift_is_pressed_ = is_pressed;
    return true;
  case LeftControl:
    this->control_is_pressed_ = is_pressed;
    return true;
  case Space:
    bVar4 = 0x20;
    break;
  case Left:
    bVar4 = 8;
    break;
  case Right:
    bVar4 = 0x15;
    break;
  case Up:
    bVar4 = 0xb;
    break;
  case Down:
    bVar4 = 10;
  }
  if (is_pressed) {
    this->last_pressed_character_ = bVar4;
    this->character_is_pressed_ = true;
    this->keyboard_input_ = bVar4 | 0x80;
    this->key_is_down_ = true;
  }
  else {
    if (bVar4 == this->last_pressed_character_) {
      this->character_is_pressed_ = false;
    }
    if ((this->keyboard_input_ & 0x3f) == bVar4) {
      this->key_is_down_ = false;
    }
  }
  return true;
}

Assistant:

bool set_key_pressed(Key key, char value, bool is_pressed, bool is_repeat) final {
				if constexpr (!is_iie(model)) {
					if(is_repeat && !repeat_is_pressed_) return true;
				}

				// If no ASCII value is supplied, look for a few special cases.
				switch(key) {
					case Key::Left:			value = 0x08;	break;
					case Key::Right:		value = 0x15;	break;
					case Key::Down:			value = 0x0a;	break;
					case Key::Up:			value = 0x0b;	break;
					case Key::Backspace:
						if(is_iie(model)) {
							value = 0x7f;
							break;
						} else {
							return false;
						}
					case Key::Enter:		value = 0x0d;	break;
					case Key::Tab:
						if (is_iie(model)) {
							value = '\t';
							break;
						} else {
							return false;
						}
					case Key::Escape:		value = 0x1b;	break;
					case Key::Space:		value = 0x20;	break;

					case Key::LeftOption:
					case Key::RightMeta:
						if (is_iie(model)) {
							open_apple_is_pressed = is_pressed;
							return true;
						} else {
							return false;
						}

					case Key::RightOption:
					case Key::LeftMeta:
						if (is_iie(model)) {
							closed_apple_is_pressed = is_pressed;
							return true;
						} else {
							return false;
						}

					case Key::LeftControl:
						control_is_pressed_ = is_pressed;
					return true;

					case Key::LeftShift:
					case Key::RightShift:
						shift_is_pressed_ = is_pressed;
					return true;

					case Key::F1:	case Key::F2:	case Key::F3:	case Key::F4:
					case Key::F5:	case Key::F6:	case Key::F7:	case Key::F8:
					case Key::F9:	case Key::F10:	case Key::F11:
						repeat_is_pressed_ = is_pressed;

						if constexpr (!is_iie(model)) {
							if(is_pressed && (!is_repeat || character_is_pressed_)) {
								keyboard_input_ = uint8_t(last_pressed_character_ | 0x80);
							}
						}
					return true;

					case Key::F12:
					case Key::PrintScreen:
					case Key::ScrollLock:
					case Key::Pause:
					case Key::Insert:
					case Key::Home:
					case Key::PageUp:
					case Key::PageDown:
					case Key::End:
						// Accept a bunch non-symbolic other keys, as
						// reset, in the hope that the user can find
						// at least one usable key.
						m6502_->set_reset_line(is_pressed);
					return true;

					default:
						if(!value) {
							return false;
						}

						// Prior to the IIe, the keyboard could produce uppercase only.
						if(!is_iie(model)) value = char(toupper(value));

						if(control_is_pressed_ && isalpha(value)) value &= 0xbf;

						// TODO: properly map IIe keys
						if(!is_iie(model) && shift_is_pressed_) {
							switch(value) {
							case 0x27: value = 0x22; break; // ' -> "
							case 0x2c: value = 0x3c; break; // , -> <
							case 0x2e: value = 0x3e; break; // . -> >
							case 0x2f: value = 0x3f; break; // / -> ?
							case 0x30: value = 0x29; break; // 0 -> )
							case 0x31: value = 0x21; break; // 1 -> !
							case 0x32: value = 0x40; break; // 2 -> @
							case 0x33: value = 0x23; break; // 3 -> #
							case 0x34: value = 0x24; break; // 4 -> $
							case 0x35: value = 0x25; break; // 5 -> %
							case 0x36: value = 0x5e; break; // 6 -> ^
							case 0x37: value = 0x26; break; // 7 -> &
							case 0x38: value = 0x2a; break; // 8 -> *
							case 0x39: value = 0x28; break; // 9 -> (
							case 0x3b: value = 0x3a; break; // ; -> :
							case 0x3d: value = 0x2b; break; // = -> +
						}
					}
					break;
				}

				if(is_pressed) {
					last_pressed_character_ = value;
					character_is_pressed_ = true;
					keyboard_input_ = uint8_t(value | 0x80);
					key_is_down_ = true;
				} else {
					if(value == last_pressed_character_) {
						character_is_pressed_ = false;
					}
					if((keyboard_input_ & 0x3f) == value) {
						key_is_down_ = false;
					}
				}

				return true;
			}